

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmainwindowlayout.cpp
# Opt level: O2

QList<QDockWidget_*> *
allMyDockWidgets(QList<QDockWidget_*> *__return_storage_ptr__,QWidget *mainWindow)

{
  undefined8 *puVar1;
  QObject *object;
  long lVar2;
  long lVar3;
  QDockWidget *pQVar4;
  QDockWidgetGroupWindow *pQVar5;
  long lVar6;
  undefined8 *puVar7;
  
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QDockWidget **)0x0;
  (__return_storage_ptr__->d).size = 0;
  puVar7 = *(undefined8 **)(*(long *)&mainWindow->field_0x8 + 0x20);
  puVar1 = puVar7 + *(long *)(*(long *)&mainWindow->field_0x8 + 0x28);
  for (; puVar7 != puVar1; puVar7 = puVar7 + 1) {
    object = (QObject *)*puVar7;
    pQVar4 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>(object);
    if (pQVar4 == (QDockWidget *)0x0) {
      pQVar5 = QtPrivate::qobject_cast_helper<QDockWidgetGroupWindow*,QObject>(object);
      if (pQVar5 != (QDockWidgetGroupWindow *)0x0) {
        lVar2 = *(long *)&(pQVar5->super_QWidget).field_0x8;
        lVar3 = *(long *)(lVar2 + 0x20);
        lVar2 = *(long *)(lVar2 + 0x28);
        for (lVar6 = 0; lVar2 << 3 != lVar6; lVar6 = lVar6 + 8) {
          pQVar4 = QtPrivate::qobject_cast_helper<QDockWidget*,QObject>
                             (*(QObject **)(lVar3 + lVar6));
          if (pQVar4 != (QDockWidget *)0x0) {
            QList<QDockWidget_*>::append(__return_storage_ptr__,pQVar4);
          }
        }
      }
    }
    else {
      QList<QDockWidget_*>::append(__return_storage_ptr__,pQVar4);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

static QList<QDockWidget*> allMyDockWidgets(const QWidget *mainWindow)
{
    QList<QDockWidget*> result;
    for (QObject *c : mainWindow->children()) {
        if (auto *dw = qobject_cast<QDockWidget*>(c)) {
            result.append(dw);
        } else if (auto *gw = qobject_cast<QDockWidgetGroupWindow*>(c)) {
            for (QObject *c : gw->children()) {
                if (auto *dw = qobject_cast<QDockWidget*>(c))
                    result.append(dw);
            }
        }
    }

    return result;
}